

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O1

block * gen_proto_abbrev(compiler_state_t *cstate,int proto)

{
  block *pbVar1;
  block *b1;
  int iVar2;
  int iVar3;
  char *fmt;
  
  switch(proto) {
  case 1:
    fmt = "link layer applied in wrong context";
    goto LAB_0010af4a;
  case 2:
    iVar3 = 0x800;
    break;
  case 3:
    iVar3 = 0x806;
    break;
  case 4:
    iVar3 = 0x8035;
    break;
  case 5:
    b1 = gen_proto(cstate,0x84,2,0);
    iVar3 = 0x84;
    goto LAB_0010ae34;
  case 6:
    b1 = gen_proto(cstate,6,2,0);
    iVar3 = 6;
    goto LAB_0010ae34;
  case 7:
    b1 = gen_proto(cstate,0x11,2,0);
    iVar3 = 0x11;
    goto LAB_0010ae34;
  case 8:
    iVar3 = 1;
    goto LAB_0010ae6d;
  case 9:
    iVar3 = 2;
    goto LAB_0010ae6d;
  case 10:
    iVar3 = 9;
    goto LAB_0010ae6d;
  case 0xb:
    iVar3 = 0x809b;
    break;
  case 0xc:
    iVar3 = 0x6003;
    break;
  case 0xd:
    iVar3 = 0x6004;
    break;
  case 0xe:
    iVar3 = 0x6007;
    break;
  case 0xf:
    iVar3 = 0x6002;
    break;
  case 0x10:
    iVar3 = 0x6001;
    break;
  case 0x11:
    iVar3 = 0x86dd;
    break;
  case 0x12:
    iVar3 = 0x3a;
    iVar2 = 0x11;
    goto LAB_0010ae72;
  case 0x13:
    b1 = gen_proto(cstate,0x33,2,0);
    iVar3 = 0x33;
    goto LAB_0010ae34;
  case 0x14:
    b1 = gen_proto(cstate,0x32,2,0);
    iVar3 = 0x32;
    goto LAB_0010ae34;
  case 0x15:
    b1 = gen_proto(cstate,0x67,2,0);
    iVar3 = 0x67;
LAB_0010ae34:
    iVar2 = 0x11;
LAB_0010ae39:
    pbVar1 = gen_proto(cstate,iVar3,iVar2,0);
LAB_0010af15:
    gen_or(pbVar1,b1);
    return b1;
  case 0x16:
  case 0x29:
    iVar3 = 0x70;
LAB_0010ae6d:
    iVar2 = 2;
LAB_0010ae72:
    pbVar1 = gen_proto(cstate,iVar3,iVar2,0);
    return pbVar1;
  case 0x17:
    iVar3 = 0x80f3;
    break;
  case 0x18:
    iVar3 = 0xfe;
    break;
  case 0x19:
    iVar3 = 0x82;
    goto LAB_0010adbc;
  case 0x1a:
    iVar3 = 0x83;
    goto LAB_0010adbc;
  case 0x1b:
    iVar3 = 0x81;
LAB_0010adbc:
    iVar2 = 0x18;
    goto LAB_0010ae72;
  case 0x1c:
    iVar3 = 0x42;
    break;
  case 0x1d:
    iVar3 = 0xe0;
    break;
  case 0x1e:
    iVar3 = 0xf0;
    break;
  case 0x1f:
    pbVar1 = gen_proto(cstate,0xf,0x1a,0);
    b1 = gen_proto(cstate,0x11,0x1a,0);
    gen_or(pbVar1,b1);
    pbVar1 = gen_proto(cstate,0x12,0x1a,0);
    gen_or(pbVar1,b1);
    pbVar1 = gen_proto(cstate,0x18,0x1a,0);
    gen_or(pbVar1,b1);
    iVar3 = 0x1a;
    goto LAB_0010ad81;
  case 0x20:
    pbVar1 = gen_proto(cstate,0x10,0x1a,0);
    b1 = gen_proto(cstate,0x11,0x1a,0);
    gen_or(pbVar1,b1);
    pbVar1 = gen_proto(cstate,0x14,0x1a,0);
    gen_or(pbVar1,b1);
    iVar3 = 0x19;
    goto LAB_0010ad62;
  case 0x21:
    pbVar1 = gen_proto(cstate,0xf,0x1a,0);
    b1 = gen_proto(cstate,0x10,0x1a,0);
    gen_or(pbVar1,b1);
    iVar3 = 0x11;
    goto LAB_0010ad81;
  default:
    abort();
  case 0x24:
    pbVar1 = gen_proto(cstate,0x18,0x1a,0);
    b1 = gen_proto(cstate,0x19,0x1a,0);
    gen_or(pbVar1,b1);
    iVar3 = 0x1a;
LAB_0010ad62:
    pbVar1 = gen_proto(cstate,iVar3,0x1a,0);
    gen_or(pbVar1,b1);
    iVar3 = 0x1b;
LAB_0010ad81:
    iVar2 = 0x1a;
    goto LAB_0010ae39;
  case 0x25:
    pbVar1 = gen_proto(cstate,0x18,0x1a,0);
    iVar3 = 0x19;
    goto LAB_0010af00;
  case 0x26:
    pbVar1 = gen_proto(cstate,0x1a,0x1a,0);
    iVar3 = 0x1b;
    goto LAB_0010af00;
  case 0x27:
    pbVar1 = gen_proto(cstate,0x12,0x1a,0);
    iVar3 = 0x14;
LAB_0010af00:
    b1 = gen_proto(cstate,iVar3,0x1a,0);
    goto LAB_0010af15;
  case 0x28:
    fmt = "\'radio\' is not a valid protocol type";
LAB_0010af4a:
    bpf_error(cstate,fmt);
  }
  pbVar1 = gen_linktype(cstate,iVar3);
  return pbVar1;
}

Assistant:

struct block *
gen_proto_abbrev(compiler_state_t *cstate, int proto)
{
	struct block *b0;
	struct block *b1;

	switch (proto) {

	case Q_SCTP:
		b1 = gen_proto(cstate, IPPROTO_SCTP, Q_IP, Q_DEFAULT);
		b0 = gen_proto(cstate, IPPROTO_SCTP, Q_IPV6, Q_DEFAULT);
		gen_or(b0, b1);
		break;

	case Q_TCP:
		b1 = gen_proto(cstate, IPPROTO_TCP, Q_IP, Q_DEFAULT);
		b0 = gen_proto(cstate, IPPROTO_TCP, Q_IPV6, Q_DEFAULT);
		gen_or(b0, b1);
		break;

	case Q_UDP:
		b1 = gen_proto(cstate, IPPROTO_UDP, Q_IP, Q_DEFAULT);
		b0 = gen_proto(cstate, IPPROTO_UDP, Q_IPV6, Q_DEFAULT);
		gen_or(b0, b1);
		break;

	case Q_ICMP:
		b1 = gen_proto(cstate, IPPROTO_ICMP, Q_IP, Q_DEFAULT);
		break;

#ifndef	IPPROTO_IGMP
#define	IPPROTO_IGMP	2
#endif

	case Q_IGMP:
		b1 = gen_proto(cstate, IPPROTO_IGMP, Q_IP, Q_DEFAULT);
		break;

#ifndef	IPPROTO_IGRP
#define	IPPROTO_IGRP	9
#endif
	case Q_IGRP:
		b1 = gen_proto(cstate, IPPROTO_IGRP, Q_IP, Q_DEFAULT);
		break;

#ifndef IPPROTO_PIM
#define IPPROTO_PIM	103
#endif

	case Q_PIM:
		b1 = gen_proto(cstate, IPPROTO_PIM, Q_IP, Q_DEFAULT);
		b0 = gen_proto(cstate, IPPROTO_PIM, Q_IPV6, Q_DEFAULT);
		gen_or(b0, b1);
		break;

#ifndef IPPROTO_VRRP
#define IPPROTO_VRRP	112
#endif

	case Q_VRRP:
		b1 = gen_proto(cstate, IPPROTO_VRRP, Q_IP, Q_DEFAULT);
		break;

#ifndef IPPROTO_CARP
#define IPPROTO_CARP	112
#endif

	case Q_CARP:
		b1 = gen_proto(cstate, IPPROTO_CARP, Q_IP, Q_DEFAULT);
		break;

	case Q_IP:
		b1 = gen_linktype(cstate, ETHERTYPE_IP);
		break;

	case Q_ARP:
		b1 = gen_linktype(cstate, ETHERTYPE_ARP);
		break;

	case Q_RARP:
		b1 = gen_linktype(cstate, ETHERTYPE_REVARP);
		break;

	case Q_LINK:
		bpf_error(cstate, "link layer applied in wrong context");

	case Q_ATALK:
		b1 = gen_linktype(cstate, ETHERTYPE_ATALK);
		break;

	case Q_AARP:
		b1 = gen_linktype(cstate, ETHERTYPE_AARP);
		break;

	case Q_DECNET:
		b1 = gen_linktype(cstate, ETHERTYPE_DN);
		break;

	case Q_SCA:
		b1 = gen_linktype(cstate, ETHERTYPE_SCA);
		break;

	case Q_LAT:
		b1 = gen_linktype(cstate, ETHERTYPE_LAT);
		break;

	case Q_MOPDL:
		b1 = gen_linktype(cstate, ETHERTYPE_MOPDL);
		break;

	case Q_MOPRC:
		b1 = gen_linktype(cstate, ETHERTYPE_MOPRC);
		break;

	case Q_IPV6:
		b1 = gen_linktype(cstate, ETHERTYPE_IPV6);
		break;

#ifndef IPPROTO_ICMPV6
#define IPPROTO_ICMPV6	58
#endif
	case Q_ICMPV6:
		b1 = gen_proto(cstate, IPPROTO_ICMPV6, Q_IPV6, Q_DEFAULT);
		break;

#ifndef IPPROTO_AH
#define IPPROTO_AH	51
#endif
	case Q_AH:
		b1 = gen_proto(cstate, IPPROTO_AH, Q_IP, Q_DEFAULT);
		b0 = gen_proto(cstate, IPPROTO_AH, Q_IPV6, Q_DEFAULT);
		gen_or(b0, b1);
		break;

#ifndef IPPROTO_ESP
#define IPPROTO_ESP	50
#endif
	case Q_ESP:
		b1 = gen_proto(cstate, IPPROTO_ESP, Q_IP, Q_DEFAULT);
		b0 = gen_proto(cstate, IPPROTO_ESP, Q_IPV6, Q_DEFAULT);
		gen_or(b0, b1);
		break;

	case Q_ISO:
		b1 = gen_linktype(cstate, LLCSAP_ISONS);
		break;

	case Q_ESIS:
		b1 = gen_proto(cstate, ISO9542_ESIS, Q_ISO, Q_DEFAULT);
		break;

	case Q_ISIS:
		b1 = gen_proto(cstate, ISO10589_ISIS, Q_ISO, Q_DEFAULT);
		break;

	case Q_ISIS_L1: /* all IS-IS Level1 PDU-Types */
		b0 = gen_proto(cstate, ISIS_L1_LAN_IIH, Q_ISIS, Q_DEFAULT);
		b1 = gen_proto(cstate, ISIS_PTP_IIH, Q_ISIS, Q_DEFAULT); /* FIXME extract the circuit-type bits */
		gen_or(b0, b1);
		b0 = gen_proto(cstate, ISIS_L1_LSP, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		b0 = gen_proto(cstate, ISIS_L1_CSNP, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		b0 = gen_proto(cstate, ISIS_L1_PSNP, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		break;

	case Q_ISIS_L2: /* all IS-IS Level2 PDU-Types */
		b0 = gen_proto(cstate, ISIS_L2_LAN_IIH, Q_ISIS, Q_DEFAULT);
		b1 = gen_proto(cstate, ISIS_PTP_IIH, Q_ISIS, Q_DEFAULT); /* FIXME extract the circuit-type bits */
		gen_or(b0, b1);
		b0 = gen_proto(cstate, ISIS_L2_LSP, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		b0 = gen_proto(cstate, ISIS_L2_CSNP, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		b0 = gen_proto(cstate, ISIS_L2_PSNP, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		break;

	case Q_ISIS_IIH: /* all IS-IS Hello PDU-Types */
		b0 = gen_proto(cstate, ISIS_L1_LAN_IIH, Q_ISIS, Q_DEFAULT);
		b1 = gen_proto(cstate, ISIS_L2_LAN_IIH, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		b0 = gen_proto(cstate, ISIS_PTP_IIH, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		break;

	case Q_ISIS_LSP:
		b0 = gen_proto(cstate, ISIS_L1_LSP, Q_ISIS, Q_DEFAULT);
		b1 = gen_proto(cstate, ISIS_L2_LSP, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		break;

	case Q_ISIS_SNP:
		b0 = gen_proto(cstate, ISIS_L1_CSNP, Q_ISIS, Q_DEFAULT);
		b1 = gen_proto(cstate, ISIS_L2_CSNP, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		b0 = gen_proto(cstate, ISIS_L1_PSNP, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		b0 = gen_proto(cstate, ISIS_L2_PSNP, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		break;

	case Q_ISIS_CSNP:
		b0 = gen_proto(cstate, ISIS_L1_CSNP, Q_ISIS, Q_DEFAULT);
		b1 = gen_proto(cstate, ISIS_L2_CSNP, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		break;

	case Q_ISIS_PSNP:
		b0 = gen_proto(cstate, ISIS_L1_PSNP, Q_ISIS, Q_DEFAULT);
		b1 = gen_proto(cstate, ISIS_L2_PSNP, Q_ISIS, Q_DEFAULT);
		gen_or(b0, b1);
		break;

	case Q_CLNP:
		b1 = gen_proto(cstate, ISO8473_CLNP, Q_ISO, Q_DEFAULT);
		break;

	case Q_STP:
		b1 = gen_linktype(cstate, LLCSAP_8021D);
		break;

	case Q_IPX:
		b1 = gen_linktype(cstate, LLCSAP_IPX);
		break;

	case Q_NETBEUI:
		b1 = gen_linktype(cstate, LLCSAP_NETBEUI);
		break;

	case Q_RADIO:
		bpf_error(cstate, "'radio' is not a valid protocol type");

	default:
		abort();
	}
	return b1;
}